

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O1

void __thiscall Assimp::MDLImporter::SearchPalette(MDLImporter *this,uchar **pszColorMap)

{
  IOSystem *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar4;
  uchar (*pauVar5) [3];
  Logger *this_00;
  long *local_48 [2];
  long local_38 [2];
  long *plVar3;
  
  pIVar1 = this->pIOHandler;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"rb","");
  iVar2 = (*pIVar1->_vptr_IOSystem[4])(pIVar1,(this->configPalette)._M_dataplus._M_p,local_48[0]);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (plVar3 == (long *)0x0) {
    pauVar5 = g_aclrDefaultColorMap;
  }
  else {
    uVar4 = (**(code **)(*plVar3 + 0x30))(plVar3);
    if (uVar4 < 0x300) {
      pauVar5 = g_aclrDefaultColorMap;
    }
    else {
      pauVar5 = (uchar (*) [3])operator_new__(0x300);
      (**(code **)(*plVar3 + 0x10))(plVar3,pauVar5,0x300,1);
      this_00 = DefaultLogger::get();
      Logger::info(this_00,
                   "Found valid colormap.lmp in directory. It will be used to decode embedded textures in palletized formats."
                  );
    }
    (**(code **)(*plVar3 + 8))(plVar3);
  }
  *pszColorMap = *pauVar5;
  return;
}

Assistant:

void MDLImporter::SearchPalette(const unsigned char** pszColorMap)
{
    // now try to find the color map in the current directory
    IOStream* pcStream = pIOHandler->Open(configPalette,"rb");

    const unsigned char* szColorMap = (const unsigned char*)::g_aclrDefaultColorMap;
    if(pcStream)
    {
        if (pcStream->FileSize() >= 768)
        {
            size_t len = 256 * 3;
            unsigned char* colorMap = new unsigned char[len];
            szColorMap = colorMap;
            pcStream->Read(colorMap, len,1);
            ASSIMP_LOG_INFO("Found valid colormap.lmp in directory. "
                "It will be used to decode embedded textures in palletized formats.");
        }
        delete pcStream;
        pcStream = NULL;
    }
    *pszColorMap = szColorMap;
}